

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

scalar __thiscall
absl::make_unique<S2ClosestEdgeQuery,S2ShapeIndex_const*&>(absl *this,S2ShapeIndex **args)

{
  S2ShapeIndex *index;
  S2ClosestEdgeQuery *this_00;
  Options local_38;
  S2ShapeIndex **local_18;
  S2ShapeIndex **args_local;
  
  local_18 = args;
  args_local = (S2ShapeIndex **)this;
  this_00 = (S2ClosestEdgeQuery *)operator_new(0x2f8);
  index = *local_18;
  local_38.super_Options.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_38.super_Options.max_error_.length2_ = 0.0;
  local_38.super_Options.max_results_ = 0;
  local_38.super_Options.include_interiors_ = false;
  local_38.super_Options.use_brute_force_ = false;
  local_38.super_Options._22_2_ = 0;
  S2ClosestEdgeQuery::Options::Options(&local_38);
  S2ClosestEdgeQuery::S2ClosestEdgeQuery(this_00,index,&local_38);
  std::unique_ptr<S2ClosestEdgeQuery,std::default_delete<S2ClosestEdgeQuery>>::
  unique_ptr<std::default_delete<S2ClosestEdgeQuery>,void>
            ((unique_ptr<S2ClosestEdgeQuery,std::default_delete<S2ClosestEdgeQuery>> *)this,this_00)
  ;
  return (__uniq_ptr_data<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>,_true,_true>)
         (__uniq_ptr_data<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}